

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,uint v)

{
  formatInteger<unsigned_int>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<< (int unsigned v){
	formatInteger(v);

	return *this;
}